

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_copy_new_frame_image(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  aom_codec_err_t aVar5;
  long *plVar6;
  YV12_BUFFER_CONFIG new_frame;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 local_1b0;
  int local_1a8;
  uint local_1a4;
  int local_1a0;
  uint local_19c;
  int local_198;
  uint local_194;
  int local_190;
  int local_18c;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  int local_130;
  undefined8 local_120;
  undefined8 local_114;
  undefined4 local_10c;
  undefined1 local_108;
  undefined8 local_104;
  undefined8 local_fc;
  undefined4 local_f0;
  undefined8 local_e8;
  YV12_BUFFER_CONFIG local_e0;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    plVar6 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    plVar6 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = plVar6 + 1;
  }
  lVar3 = *plVar6;
  if (lVar3 == 0) {
    aVar5 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar4 = av1_get_last_show_frame(ctx->ppi->cpi,&local_e0);
    aVar5 = AOM_CODEC_ERROR;
    if (iVar4 == 0) {
      local_188 = *(ulong *)(lVar3 + 0x40);
      local_180 = *(ulong *)(lVar3 + 0x48);
      local_178 = *(ulong *)(lVar3 + 0x50);
      local_1a0 = *(int *)(lVar3 + 0x28);
      local_198 = *(int *)(lVar3 + 0x2c);
      local_fc = *(undefined8 *)(lVar3 + 0x30);
      local_1b0.field_0.y_width = *(int *)(lVar3 + 0x1c);
      local_1a8 = *(int *)(lVar3 + 0x20);
      iVar4 = *(int *)(lVar3 + 0x38);
      local_1b0.field_0.uv_width = (uint)(local_1b0.field_0.y_width + iVar4) >> ((byte)iVar4 & 0x1f)
      ;
      iVar2 = *(int *)(lVar3 + 0x3c);
      local_1a4 = (uint)(local_1a8 + iVar2) >> ((byte)iVar2 & 0x1f);
      local_19c = (uint)(iVar4 + local_1a0) >> ((byte)iVar4 & 0x1f);
      local_194 = (uint)(iVar2 + local_198) >> ((byte)iVar2 & 0x1f);
      local_190 = *(int *)(lVar3 + 0x58);
      local_18c = *(int *)(lVar3 + 0x5c);
      local_114 = *(undefined8 *)(lVar3 + 4);
      local_10c = *(undefined4 *)(lVar3 + 0xc);
      local_108 = *(undefined1 *)(lVar3 + 0x10);
      local_104 = *(undefined8 *)(lVar3 + 0x14);
      local_f0 = 0;
      if ((*(byte *)(lVar3 + 1) & 8) != 0) {
        local_188 = local_188 >> 1;
        local_180 = local_180 >> 1;
        local_178 = local_178 >> 1;
        local_190 = local_190 >> 1;
        local_18c = local_18c >> 1;
        local_f0 = 8;
      }
      iVar4 = local_190 - (*(int *)(lVar3 + 0x1c) + 0x1fU & 0xffffffe0);
      local_130 = 0;
      if (0 < iVar4 / 2) {
        local_130 = iVar4 / 2;
      }
      local_120 = *(undefined8 *)(lVar3 + 0x38);
      local_e8 = *(undefined8 *)(lVar3 + 0x98);
      aVar5 = av1_copy_new_frame_enc
                        (&ctx->ppi->cpi->common,&local_e0,(YV12_BUFFER_CONFIG *)&local_1b0.field_0);
    }
  }
  return aVar5;
}

Assistant:

static aom_codec_err_t ctrl_copy_new_frame_image(aom_codec_alg_priv_t *ctx,
                                                 va_list args) {
  aom_image_t *const new_img = va_arg(args, aom_image_t *);

  if (new_img != NULL) {
    YV12_BUFFER_CONFIG new_frame;

    if (av1_get_last_show_frame(ctx->ppi->cpi, &new_frame) == 0) {
      YV12_BUFFER_CONFIG sd;
      image2yuvconfig(new_img, &sd);
      return av1_copy_new_frame_enc(&ctx->ppi->cpi->common, &new_frame, &sd);
    } else {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}